

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::~MessageGenerator(MessageGenerator *this)

{
  MessageGenerator *this_local;
  
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
  ::~scoped_array(&this->extension_generators_);
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
  ::~scoped_array(&this->enum_generators_);
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
  ::~scoped_array(&this->nested_generators_);
  std::vector<int,_std::allocator<int>_>::~vector(&this->has_bit_indices_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(&this->optimized_order_);
  FieldGeneratorMap::~FieldGeneratorMap(&this->field_generators_);
  Options::~Options(&this->options_);
  std::__cxx11::string::~string((string *)&this->classname_);
  return;
}

Assistant:

MessageGenerator::~MessageGenerator() {}